

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::push_back(internalJSONNode *this,JSONNode *node)

{
  jsonChildren *this_00;
  bool bVar1;
  json_string *__lhs;
  JSONNode *item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  JSONNode *local_18;
  JSONNode *node_local;
  internalJSONNode *this_local;
  
  local_18 = node;
  node_local = (JSONNode *)this;
  bVar1 = isContainer(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = this->Children;
    item = ::JSONNode::newJSONNode(local_18);
    jsonChildren::push_back(this_00,item);
  }
  else {
    __lhs = jsonSingletonERROR_NON_CONTAINER::getValue_abi_cxx11_();
    std::operator+(&local_38,__lhs,"push_back");
    JSONDebug::_JSON_FAIL(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void internalJSONNode::push_back(const JSONNode & node) json_nothrow {
#endif /*<- */
    JSON_ASSERT_SAFE(isContainer(), json_global(ERROR_NON_CONTAINER) + JSON_TEXT("push_back"), return;);
    #ifdef JSON_LIBRARY /*-> JSON_LIBRARY */
	   #ifdef JSON_MUTEX_CALLBACKS /*-> JSON_MUTEX_CALLBACKS */
		  if (mylock != 0) node -> set_mutex(mylock);
	   #endif /*<- */
	   CHILDREN -> push_back(node);
    #else /*<- else */
	   CHILDREN -> push_back(JSONNode::newJSONNode(node   JSON_MUTEX_COPY));
    #endif /*<- */
}